

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackage.cpp
# Opt level: O2

void __thiscall
MPL::detail::ModelPackageImpl::createItemInfoEntry
          (ModelPackageImpl *this,string *identifier,string *path,string *name,string *author,
          string *description)

{
  JsonMap *this_00;
  undefined8 uVar1;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntries;
  unique_ptr<JsonMap,_std::default_delete<JsonMap>_> itemInfoEntry;
  _Alloc_hider local_88;
  undefined1 local_80 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  undefined1 local_50 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Alloc_hider local_38;
  
  local_48._8_8_ = identifier;
  local_38._M_p = (pointer)author;
  getItemInfoEntry((ModelPackageImpl *)local_80,(string *)this);
  if ((JsonMap *)local_80._0_8_ == (JsonMap *)0x0) {
    std::make_unique<JsonMap>();
    uVar1 = local_70[0]._M_allocated_capacity;
    local_70[0]._M_allocated_capacity = (pointer)0x0;
    std::__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>::reset
              ((__uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_> *)local_80,(pointer)uVar1);
    std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
              ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)
               &local_70[0]._M_allocated_capacity);
  }
  uVar1 = local_80._0_8_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70[0]._M_local_buf,"path",(allocator<char> *)&local_88);
  JsonMap::setString((JsonMap *)uVar1,(string *)local_70,path);
  std::__cxx11::string::~string((string *)local_70[0]._M_local_buf);
  uVar1 = local_80._0_8_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70[0]._M_local_buf,"name",(allocator<char> *)&local_88);
  JsonMap::setString((JsonMap *)uVar1,(string *)local_70,name);
  std::__cxx11::string::~string((string *)local_70[0]._M_local_buf);
  uVar1 = local_80._0_8_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70[0]._M_local_buf,"author",(allocator<char> *)&local_88);
  JsonMap::setString((JsonMap *)uVar1,(string *)local_70,(string *)local_38._M_p);
  std::__cxx11::string::~string((string *)local_70[0]._M_local_buf);
  uVar1 = local_80._0_8_;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70[0]._M_local_buf,"description",(allocator<char> *)&local_88);
  JsonMap::setString((JsonMap *)uVar1,(string *)local_70,description);
  std::__cxx11::string::~string((string *)local_70[0]._M_local_buf);
  getItemInfoEntries((ModelPackageImpl *)&local_88);
  local_48._M_allocated_capacity = local_80._0_8_;
  local_80._0_8_ = (pointer)0x0;
  JsonMap::setObject((JsonMap *)local_88._M_p,(string *)local_48._8_8_,
                     (unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)(local_50 + 8));
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)(local_50 + 8));
  this_00 = (this->m_manifest)._M_t.super___uniq_ptr_impl<JsonMap,_std::default_delete<JsonMap>_>.
            _M_t.super__Tuple_impl<0UL,_JsonMap_*,_std::default_delete<JsonMap>_>.
            super__Head_base<0UL,_JsonMap_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70[0]._M_local_buf,"itemInfoEntries",
             (allocator<char> *)(local_80 + 0xf));
  local_50 = (undefined1  [8])local_88._M_p;
  local_88._M_p = (pointer)0x0;
  JsonMap::setObject(this_00,(string *)local_70,
                     (unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_50);
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_50);
  std::__cxx11::string::~string((string *)local_70[0]._M_local_buf);
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)&local_88);
  std::unique_ptr<JsonMap,_std::default_delete<JsonMap>_>::~unique_ptr
            ((unique_ptr<JsonMap,_std::default_delete<JsonMap>_> *)local_80);
  return;
}

Assistant:

void ModelPackageImpl::createItemInfoEntry(const std::string& identifier, const std::string& path, const std::string& name, const std::string& author, const std::string& description) {
    auto itemInfoEntry = getItemInfoEntry(identifier);
    
    if (nullptr == itemInfoEntry) {
        itemInfoEntry = std::make_unique<JsonMap>();
    }
    
    itemInfoEntry->setString(kModelPackageItemInfoPathKey, path);
    itemInfoEntry->setString(kModelPackageItemInfoNameKey, name);
    itemInfoEntry->setString(kModelPackageItemInfoAuthorKey, author);
    itemInfoEntry->setString(kModelPackageItemInfoDescriptionKey, description);
    
    auto itemInfoEntries = getItemInfoEntries();
    itemInfoEntries->setObject(identifier, std::move(itemInfoEntry));
    m_manifest->setObject(kModelPackageItemInfoEntriesKey, std::move(itemInfoEntries));
}